

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<double>_>::Print
          (TPZEqnArray<std::complex<double>_> *this,char *name,ostream *out)

{
  ostream *poVar1;
  int64_t iVar2;
  int *piVar3;
  complex *pcVar4;
  ostream *in_RDX;
  char *in_RSI;
  long in_RDI;
  int aux_limit;
  int j;
  int i;
  int local_24;
  int local_20;
  int local_1c;
  
  if (in_RSI != (char *)0x0) {
    poVar1 = std::operator<<(in_RDX,in_RSI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 4); local_1c = local_1c + 1) {
    if (local_1c == *(int *)(in_RDI + 4) + -1) {
      iVar2 = TPZVec<std::complex<double>_>::NElements
                        ((TPZVec<std::complex<double>_> *)(in_RDI + 0x368));
      local_24 = (int)iVar2;
    }
    else {
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 8),(long)(local_1c + 1));
      local_24 = *piVar3;
    }
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 8),(long)local_1c);
    for (local_20 = *piVar3; local_20 < local_24; local_20 = local_20 + 1) {
      poVar1 = std::operator<<(in_RDX,"col = ");
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x4208),(long)local_20);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*piVar3);
      std::operator<<(poVar1,"   ");
    }
    std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 8),(long)local_1c);
    for (local_20 = *piVar3; local_20 < local_24; local_20 = local_20 + 1) {
      pcVar4 = (complex *)
               TPZVec<std::complex<double>_>::operator[]
                         ((TPZVec<std::complex<double>_> *)(in_RDI + 0x368),(long)local_20);
      poVar1 = std::operator<<(in_RDX,pcVar4);
      std::operator<<(poVar1,"  ");
    }
    std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::Print(const char *name, std::ostream& out)
{
	if(name) out << name << endl;
	int i,j;
	for(i=0;i<fNumEq;i++){
		int aux_limit;
		
		if(i==fNumEq-1){
			aux_limit=fEqValues.NElements();
		}else aux_limit=fEqStart[i+1];
		for(j=fEqStart[i]; j<aux_limit ; j++) {
			out << "col = " << fIndex[j] << "   ";
		}
		out << endl;
		for(j=fEqStart[i]; j<aux_limit ; j++) {
			out << fEqValues[j] << "  ";
		}
		out << endl;
		out << endl;
	}
}